

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-interpreter.h
# Opt level: O0

Flow * __thiscall
wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visit
          (Flow *__return_storage_ptr__,ExpressionRunner<wasm::PrecomputingExpressionRunner> *this,
          Expression *curr)

{
  bool bVar1;
  ostream *poVar2;
  Type local_40;
  Type type;
  Expression *curr_local;
  ExpressionRunner<wasm::PrecomputingExpressionRunner> *this_local;
  Flow *ret;
  
  this->depth = this->depth + 1;
  if ((this->maxDepth != 0) && (this->maxDepth < this->depth)) {
    (*this->_vptr_ExpressionRunner[3])(this,"interpreter recursion limit");
  }
  Visitor<wasm::PrecomputingExpressionRunner,_wasm::Flow>::visit
            (__return_storage_ptr__,(Visitor<wasm::PrecomputingExpressionRunner,_wasm::Flow> *)this,
             curr);
  bVar1 = Flow::breaking(__return_storage_ptr__);
  if (!bVar1) {
    local_40 = Flow::getType(__return_storage_ptr__);
    bVar1 = wasm::Type::isConcrete(&local_40);
    if ((bVar1) || (bVar1 = wasm::Type::isConcrete(&curr->type), bVar1)) {
      bVar1 = wasm::Type::isSubType(local_40,(Type)(curr->type).id);
      if (!bVar1) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"expected ");
        poVar2 = wasm::operator<<(poVar2,(Type)(curr->type).id);
        poVar2 = std::operator<<(poVar2,", seeing ");
        poVar2 = wasm::operator<<(poVar2,local_40);
        poVar2 = std::operator<<(poVar2," from\n");
        poVar2 = std::operator<<(poVar2,curr);
        std::operator<<(poVar2,'\n');
      }
      bVar1 = wasm::Type::isSubType(local_40,(Type)(curr->type).id);
      if (!bVar1) {
        __assert_fail("Type::isSubType(type, curr->type)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/dcodeIO[P]binaryen/src/wasm-interpreter.h"
                      ,0xcf,
                      "Flow wasm::ExpressionRunner<wasm::PrecomputingExpressionRunner>::visit(Expression *) [SubType = wasm::PrecomputingExpressionRunner]"
                     );
      }
    }
  }
  this->depth = this->depth - 1;
  return __return_storage_ptr__;
}

Assistant:

Flow visit(Expression* curr) {
    depth++;
    if (maxDepth != NO_LIMIT && depth > maxDepth) {
      hostLimit("interpreter recursion limit");
    }
    auto ret = OverriddenVisitor<SubType, Flow>::visit(curr);
    if (!ret.breaking()) {
      Type type = ret.getType();
      if (type.isConcrete() || curr->type.isConcrete()) {
#if 1 // def WASM_INTERPRETER_DEBUG
        if (!Type::isSubType(type, curr->type)) {
          std::cerr << "expected " << curr->type << ", seeing " << type
                    << " from\n"
                    << *curr << '\n';
        }
#endif
        assert(Type::isSubType(type, curr->type));
      }
    }
    depth--;
    return ret;
  }